

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O1

void __thiscall Movegen::generate<(Movetype)14,(Piece)6>(Movegen *this)

{
  Square *pSVar1;
  Color CVar2;
  long lVar3;
  byte bVar4;
  U8 UVar5;
  ulong uVar6;
  Square *pSVar7;
  U64 UVar8;
  U64 UVar9;
  int iVar10;
  code *pcVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  U8 *pUVar15;
  Square SVar16;
  U8 UVar17;
  ulong uVar18;
  U64 mvs;
  ulong local_38;
  
  uVar6 = this->check_target;
  if (uVar6 == 0) {
    generate<(Movetype)16,(Piece)0>(this);
    local_38 = 0;
    if (this->pawns7 != 0) {
      pcVar11 = anon_unknown.dwarf_1604f3::shift<(Dir)1>;
      if (this->us == white) {
        pcVar11 = anon_unknown.dwarf_1604f3::shift<(Dir)0>;
      }
      local_38 = this->pawns7;
      (*pcVar11)(&local_38);
      local_38 = local_38 & this->qtarget;
    }
    if (local_38 != 0) {
      CVar2 = this->us;
      uVar6 = (ulong)this->last;
      pUVar15 = &this->list[uVar6 + 3].type;
      do {
        lVar3 = 0;
        if (local_38 != 0) {
          for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        UVar5 = (U8)lVar3;
        UVar17 = (CVar2 != white) * '\x10' + -8 + UVar5;
        uVar13 = (int)uVar6 + 4;
        uVar6 = (ulong)uVar13;
        pUVar15[-0xb] = UVar17;
        pUVar15[-10] = UVar5;
        pUVar15[-9] = 0;
        pUVar15[-8] = UVar17;
        pUVar15[-7] = UVar5;
        pUVar15[-6] = 1;
        pUVar15[-5] = UVar17;
        pUVar15[-4] = UVar5;
        pUVar15[-3] = 2;
        ((Move *)(pUVar15 + -2))->f = UVar17;
        pUVar15[-1] = UVar5;
        *pUVar15 = '\x03';
        pUVar15 = pUVar15 + 0xc;
        local_38 = local_38 - 1 & local_38;
      } while (local_38 != 0);
      this->last = uVar13;
      local_38 = 0;
    }
    pSVar7 = this->knights;
    SVar16 = *pSVar7;
    if (SVar16 != no_square) {
      iVar10 = this->last;
      uVar6 = this->qtarget;
      uVar12 = this->ctarget;
      do {
        uVar14 = (&bitboards::nmask)[SVar16];
        uVar18 = uVar14 & uVar6;
        if (uVar18 != 0) {
          pUVar15 = &this->list[iVar10].type;
          do {
            lVar3 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            iVar10 = iVar10 + 1;
            uVar18 = uVar18 & uVar18 - 1;
          } while (uVar18 != 0);
          this->last = iVar10;
        }
        uVar14 = uVar14 & uVar12;
        if (uVar14 != 0) {
          pUVar15 = &this->list[iVar10].type;
          do {
            lVar3 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            iVar10 = iVar10 + 1;
            uVar14 = uVar14 & uVar14 - 1;
          } while (uVar14 != 0);
          this->last = iVar10;
        }
        SVar16 = pSVar7[1];
        pSVar7 = pSVar7 + 1;
      } while (SVar16 != no_square);
    }
    pSVar7 = this->bishops;
    if (*pSVar7 != no_square) {
      do {
        UVar8 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar7);
        uVar6 = this->qtarget & UVar8;
        if (uVar6 != 0) {
          SVar16 = *pSVar7;
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        uVar6 = UVar8 & this->ctarget;
        if (uVar6 != 0) {
          SVar16 = *pSVar7;
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        pSVar1 = pSVar7 + 1;
        pSVar7 = pSVar7 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar7 = this->rooks;
    if (*pSVar7 != no_square) {
      do {
        UVar8 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar7);
        uVar6 = this->qtarget & UVar8;
        if (uVar6 != 0) {
          SVar16 = *pSVar7;
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        uVar6 = UVar8 & this->ctarget;
        if (uVar6 != 0) {
          SVar16 = *pSVar7;
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        pSVar1 = pSVar7 + 1;
        pSVar7 = pSVar7 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar7 = this->queens;
    if (*pSVar7 != no_square) {
      do {
        UVar8 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar7);
        UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar7);
        uVar6 = this->qtarget & (UVar9 | UVar8);
        if (uVar6 != 0) {
          SVar16 = *pSVar7;
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        uVar6 = (UVar9 | UVar8) & this->ctarget;
        if (uVar6 != 0) {
          SVar16 = *pSVar7;
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        pSVar1 = pSVar7 + 1;
        pSVar7 = pSVar7 + 1;
      } while (*pSVar1 != no_square);
    }
    generate<(Movetype)11,(Piece)0>(this);
    generate<(Movetype)10,(Piece)0>(this);
    uVar6 = (&bitboards::kmask)[*this->kings];
    uVar12 = this->empty & uVar6;
    UVar5 = (U8)*this->kings;
    if (uVar12 != 0) {
      uVar14 = (ulong)this->last;
      pUVar15 = &this->list[uVar14].type;
      do {
        lVar3 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar15 + -2))->f = UVar5;
        pUVar15[-1] = (U8)lVar3;
        *pUVar15 = '\n';
        pUVar15 = pUVar15 + 3;
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
        uVar12 = uVar12 & uVar12 - 1;
      } while (uVar12 != 0);
      this->last = uVar13;
    }
    if (this->can_castle_ks == true) {
      iVar10 = this->last;
      this->last = iVar10 + 1;
      UVar17 = '>';
      if (this->us == white) {
        UVar17 = '\x06';
      }
      this->list[iVar10].f = UVar5;
      this->list[iVar10].t = UVar17;
      this->list[iVar10].type = '\b';
    }
    if (this->can_castle_qs == true) {
      iVar10 = this->last;
      this->last = iVar10 + 1;
      UVar17 = ':';
      if (this->us == white) {
        UVar17 = '\x02';
      }
      this->list[iVar10].f = UVar5;
      this->list[iVar10].t = UVar17;
      this->list[iVar10].type = '\t';
    }
    uVar6 = uVar6 & this->enemies;
    if (uVar6 == 0) {
      return;
    }
    uVar12 = (ulong)this->last;
    pUVar15 = &this->list[uVar12].type;
    do {
      lVar3 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      ((Move *)(pUVar15 + -2))->f = UVar5;
      pUVar15[-1] = (U8)lVar3;
      *pUVar15 = '\v';
      pUVar15 = pUVar15 + 3;
      uVar13 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar13;
      uVar6 = uVar6 & uVar6 - 1;
    } while (uVar6 != 0);
  }
  else {
    uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
    uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
    bVar4 = (byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    if (this->evasion_target == 0) {
      if (bVar4 < 2) {
        generate<(Movetype)16,(Piece)0>(this);
        SVar16 = *this->kings;
        uVar6 = this->enemies & (&bitboards::kmask)[SVar16];
        if (uVar6 != 0) {
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        generate<(Movetype)11,(Piece)0>(this);
        pSVar7 = this->knights;
        SVar16 = *pSVar7;
        if (SVar16 != no_square) {
          iVar10 = this->last;
          uVar6 = this->ctarget;
          do {
            uVar12 = (&bitboards::nmask)[SVar16] & uVar6;
            if (uVar12 != 0) {
              pUVar15 = &this->list[iVar10].type;
              do {
                lVar3 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                iVar10 = iVar10 + 1;
                uVar12 = uVar12 & uVar12 - 1;
              } while (uVar12 != 0);
              this->last = iVar10;
            }
            SVar16 = pSVar7[1];
            pSVar7 = pSVar7 + 1;
          } while (SVar16 != no_square);
        }
        pSVar7 = this->bishops;
        if (*pSVar7 != no_square) {
          do {
            UVar8 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar7);
            uVar6 = UVar8 & this->ctarget;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            pSVar1 = pSVar7 + 1;
            pSVar7 = pSVar7 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar7 = this->rooks;
        if (*pSVar7 != no_square) {
          do {
            UVar8 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar7);
            uVar6 = UVar8 & this->ctarget;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            pSVar1 = pSVar7 + 1;
            pSVar7 = pSVar7 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar7 = this->queens;
        if (*pSVar7 != no_square) {
          do {
            UVar8 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar7);
            UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar7);
            uVar6 = (UVar9 | UVar8) & this->ctarget;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            pSVar1 = pSVar7 + 1;
            pSVar7 = pSVar7 + 1;
          } while (*pSVar1 != no_square);
        }
        SVar16 = *this->kings;
        uVar6 = this->empty & (&bitboards::kmask)[SVar16];
        if (uVar6 == 0) {
          return;
        }
        uVar12 = (ulong)this->last;
        pUVar15 = &this->list[uVar12].type;
        do {
          lVar3 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
          pUVar15[-1] = (U8)lVar3;
          *pUVar15 = '\n';
          pUVar15 = pUVar15 + 3;
          uVar13 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar13;
          uVar6 = uVar6 & uVar6 - 1;
        } while (uVar6 != 0);
      }
      else {
        uVar6 = (&bitboards::kmask)[*this->kings];
        uVar12 = this->enemies & uVar6;
        UVar5 = (U8)*this->kings;
        if (uVar12 != 0) {
          uVar14 = (ulong)this->last;
          pUVar15 = &this->list[uVar14].type;
          do {
            lVar3 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = UVar5;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
            uVar12 = uVar12 & uVar12 - 1;
          } while (uVar12 != 0);
          this->last = uVar13;
        }
        uVar6 = uVar6 & this->empty;
        if (uVar6 == 0) {
          return;
        }
        uVar12 = (ulong)this->last;
        pUVar15 = &this->list[uVar12].type;
        do {
          lVar3 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar15 + -2))->f = UVar5;
          pUVar15[-1] = (U8)lVar3;
          *pUVar15 = '\n';
          pUVar15 = pUVar15 + 3;
          uVar13 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar13;
          uVar6 = uVar6 & uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    else {
      if (bVar4 < 2) {
        generate<(Movetype)16,(Piece)0>(this);
        SVar16 = *this->kings;
        uVar6 = this->enemies & (&bitboards::kmask)[SVar16];
        if (uVar6 != 0) {
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\v';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        generate<(Movetype)11,(Piece)0>(this);
        pSVar7 = this->knights;
        SVar16 = *pSVar7;
        if (SVar16 != no_square) {
          iVar10 = this->last;
          uVar6 = this->qtarget;
          uVar12 = this->ctarget;
          do {
            uVar14 = (&bitboards::nmask)[SVar16];
            uVar18 = uVar14 & uVar6;
            if (uVar18 != 0) {
              pUVar15 = &this->list[iVar10].type;
              do {
                lVar3 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                iVar10 = iVar10 + 1;
                uVar18 = uVar18 & uVar18 - 1;
              } while (uVar18 != 0);
              this->last = iVar10;
            }
            uVar14 = uVar14 & uVar12;
            if (uVar14 != 0) {
              pUVar15 = &this->list[iVar10].type;
              do {
                lVar3 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                iVar10 = iVar10 + 1;
                uVar14 = uVar14 & uVar14 - 1;
              } while (uVar14 != 0);
              this->last = iVar10;
            }
            SVar16 = pSVar7[1];
            pSVar7 = pSVar7 + 1;
          } while (SVar16 != no_square);
        }
        pSVar7 = this->bishops;
        if (*pSVar7 != no_square) {
          do {
            UVar8 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar7);
            uVar6 = this->qtarget & UVar8;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            uVar6 = UVar8 & this->ctarget;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            pSVar1 = pSVar7 + 1;
            pSVar7 = pSVar7 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar7 = this->rooks;
        if (*pSVar7 != no_square) {
          do {
            UVar8 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar7);
            uVar6 = this->qtarget & UVar8;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            uVar6 = UVar8 & this->ctarget;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            pSVar1 = pSVar7 + 1;
            pSVar7 = pSVar7 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar7 = this->queens;
        if (*pSVar7 != no_square) {
          do {
            UVar8 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar7);
            UVar9 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar7);
            uVar6 = this->qtarget & (UVar9 | UVar8);
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            uVar6 = (UVar9 | UVar8) & this->ctarget;
            if (uVar6 != 0) {
              SVar16 = *pSVar7;
              uVar12 = (ulong)this->last;
              pUVar15 = &this->list[uVar12].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar16;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\v';
                pUVar15 = pUVar15 + 3;
                uVar13 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar13;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar13;
            }
            pSVar1 = pSVar7 + 1;
            pSVar7 = pSVar7 + 1;
          } while (*pSVar1 != no_square);
        }
        local_38 = 0;
        if (this->pawns7 != 0) {
          pcVar11 = anon_unknown.dwarf_1604f3::shift<(Dir)1>;
          if (this->us == white) {
            pcVar11 = anon_unknown.dwarf_1604f3::shift<(Dir)0>;
          }
          local_38 = this->pawns7;
          (*pcVar11)(&local_38);
          local_38 = local_38 & this->qtarget;
        }
        if (local_38 != 0) {
          CVar2 = this->us;
          uVar6 = (ulong)this->last;
          pUVar15 = &this->list[uVar6 + 3].type;
          do {
            lVar3 = 0;
            if (local_38 != 0) {
              for (; (local_38 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            UVar5 = (U8)lVar3;
            UVar17 = (CVar2 != white) * '\x10' + -8 + UVar5;
            uVar13 = (int)uVar6 + 4;
            uVar6 = (ulong)uVar13;
            pUVar15[-0xb] = UVar17;
            pUVar15[-10] = UVar5;
            pUVar15[-9] = 0;
            pUVar15[-8] = UVar17;
            pUVar15[-7] = UVar5;
            pUVar15[-6] = 1;
            pUVar15[-5] = UVar17;
            pUVar15[-4] = UVar5;
            pUVar15[-3] = 2;
            ((Move *)(pUVar15 + -2))->f = UVar17;
            pUVar15[-1] = UVar5;
            *pUVar15 = '\x03';
            pUVar15 = pUVar15 + 0xc;
            local_38 = local_38 - 1 & local_38;
          } while (local_38 != 0);
          this->last = uVar13;
          local_38 = 0;
        }
        SVar16 = *this->kings;
        uVar6 = this->empty & (&bitboards::kmask)[SVar16];
        if (uVar6 != 0) {
          uVar12 = (ulong)this->last;
          pUVar15 = &this->list[uVar12].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (U8)SVar16;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar13 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar13;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar13;
        }
        generate<(Movetype)10,(Piece)0>(this);
        return;
      }
      uVar6 = (&bitboards::kmask)[*this->kings];
      uVar12 = this->enemies & uVar6;
      UVar5 = (U8)*this->kings;
      if (uVar12 != 0) {
        uVar14 = (ulong)this->last;
        pUVar15 = &this->list[uVar14].type;
        do {
          lVar3 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          ((Move *)(pUVar15 + -2))->f = UVar5;
          pUVar15[-1] = (U8)lVar3;
          *pUVar15 = '\v';
          pUVar15 = pUVar15 + 3;
          uVar13 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar13;
          uVar12 = uVar12 & uVar12 - 1;
        } while (uVar12 != 0);
        this->last = uVar13;
      }
      uVar6 = uVar6 & this->empty;
      if (uVar6 == 0) {
        return;
      }
      uVar12 = (ulong)this->last;
      pUVar15 = &this->list[uVar12].type;
      do {
        lVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar15 + -2))->f = UVar5;
        pUVar15[-1] = (U8)lVar3;
        *pUVar15 = '\n';
        pUVar15 = pUVar15 + 3;
        uVar13 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar13;
        uVar6 = uVar6 & uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  this->last = uVar13;
  return;
}

Assistant:

inline void Movegen::generate<pseudo_legal, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) { // all moves
		generate<capture_promotion, pawn>();
		generate<promotion, pawn>();
		generate<pseudo_legal, knight>();
		generate<pseudo_legal, bishop>();
		generate<pseudo_legal, rook>();
		generate<pseudo_legal, queen>();
		generate<capture, pawn>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
		generate<capture, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
			generate<quiet, king>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			// capture moves
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<pseudo_legal, knight>();
			generate<pseudo_legal, bishop>();
			generate<pseudo_legal, rook>();
			generate<pseudo_legal, queen>();

			// blocking moves
			generate<promotion, pawn>();
			generate<quiet, king>();
			generate<quiet, pawn>();
		}
		else {
			generate<capture, king>();
			generate<quiet, king>(); // more than one checker
		}
	}
}